

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O3

int testSpanTestsAccessImmutable(void)

{
  reference piVar1;
  ostream *poVar2;
  initializer_list<int> __l;
  Span<const_int,_18446744073709551615UL> span;
  vector<int,_std::allocator<int>_> values;
  allocator_type local_39;
  Span<const_int,_18446744073709551615UL> local_38;
  vector<int,_std::allocator<int>_> local_28;
  
  local_38.m_ptr = (pointer)0x200000001;
  local_38.m_size.m_size = 0x400000003;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_38;
  std::vector<int,_std::allocator<int>_>::vector(&local_28,__l,&local_39);
  local_38.m_ptr =
       local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  if ((long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == 0) {
    local_38.m_ptr = (pointer)0x0;
  }
  local_38.m_size.m_size =
       (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  piVar1 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::operator[](&local_38,0);
  if (*piVar1 == 1) {
    piVar1 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::At(&local_38,1);
    if (*piVar1 == 2) {
      MILBlob::Util::Span<const_int,_18446744073709551615UL>::At(&local_38,5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::clog,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                 ,0x71);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,":",1);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::clog,0xf3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,": expected exception, but none thrown.\n",0x27);
      goto LAB_001bd564;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
               ,0x71);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xf2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(span.At(1)) == (2)",0x13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
               ,0x71);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xf1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(span[0]) == (1)",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  }
  std::ostream::put((char)poVar2);
  std::ostream::flush();
LAB_001bd564:
  if (local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 1;
}

Assistant:

int testSpanTestsAccessImmutable()
{
    const std::vector<int> values = {1, 2, 3, 4};
    auto span = MakeSpan(values);

    ML_ASSERT_EQ(span[0], 1);
    ML_ASSERT_EQ(span.At(1), 2);
    ML_ASSERT_THROWS(span.At(5), std::range_error);

    static_assert(std::is_same<decltype(span[0]), const int&>::value, "span[0] should not be mutable");
    static_assert(std::is_same<decltype(span.At(0)), const int&>::value, "span.At(0) should not be mutable");

    return 0;
}